

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepared_statement.cpp
# Opt level: O1

void __thiscall
duckdb::PreparedStatement::PreparedStatement(PreparedStatement *this,ErrorData *error)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  ExceptionType EVar7;
  
  (this->data).internal.
  super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->data).internal.
  super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->context).internal.super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->context).internal.super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->query)._M_dataplus._M_p = (pointer)&(this->query).field_2;
  (this->query)._M_string_length = 0;
  (this->query).field_2._M_local_buf[0] = '\0';
  this->success = false;
  EVar7 = error->type;
  (this->error).initialized = error->initialized;
  (this->error).type = EVar7;
  paVar2 = &(this->error).raw_message.field_2;
  (this->error).raw_message._M_dataplus._M_p = (pointer)paVar2;
  pcVar3 = (error->raw_message)._M_dataplus._M_p;
  paVar1 = &(error->raw_message).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar4 = *(undefined4 *)((long)&(error->raw_message).field_2 + 4);
    uVar5 = *(undefined4 *)((long)&(error->raw_message).field_2 + 8);
    uVar6 = *(undefined4 *)((long)&(error->raw_message).field_2 + 0xc);
    *(undefined4 *)paVar2 = *(undefined4 *)paVar1;
    *(undefined4 *)((long)&(this->error).raw_message.field_2 + 4) = uVar4;
    *(undefined4 *)((long)&(this->error).raw_message.field_2 + 8) = uVar5;
    *(undefined4 *)((long)&(this->error).raw_message.field_2 + 0xc) = uVar6;
  }
  else {
    (this->error).raw_message._M_dataplus._M_p = pcVar3;
    (this->error).raw_message.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->error).raw_message._M_string_length = (error->raw_message)._M_string_length;
  (error->raw_message)._M_dataplus._M_p = (pointer)paVar1;
  (error->raw_message)._M_string_length = 0;
  (error->raw_message).field_2._M_local_buf[0] = '\0';
  paVar1 = &(this->error).final_message.field_2;
  (this->error).final_message._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (error->final_message)._M_dataplus._M_p;
  paVar2 = &(error->final_message).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined4 *)((long)&(error->final_message).field_2 + 4);
    uVar5 = *(undefined4 *)((long)&(error->final_message).field_2 + 8);
    uVar6 = *(undefined4 *)((long)&(error->final_message).field_2 + 0xc);
    *(undefined4 *)paVar1 = *(undefined4 *)paVar2;
    *(undefined4 *)((long)&(this->error).final_message.field_2 + 4) = uVar4;
    *(undefined4 *)((long)&(this->error).final_message.field_2 + 8) = uVar5;
    *(undefined4 *)((long)&(this->error).final_message.field_2 + 0xc) = uVar6;
  }
  else {
    (this->error).final_message._M_dataplus._M_p = pcVar3;
    (this->error).final_message.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->error).final_message._M_string_length = (error->final_message)._M_string_length;
  (error->final_message)._M_dataplus._M_p = (pointer)paVar2;
  (error->final_message)._M_string_length = 0;
  (error->final_message).field_2._M_local_buf[0] = '\0';
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)&(this->error).extra_info,&error->extra_info,&error->extra_info);
  (this->named_param_map)._M_h._M_buckets = &(this->named_param_map)._M_h._M_single_bucket;
  (this->named_param_map)._M_h._M_bucket_count = 1;
  (this->named_param_map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->named_param_map)._M_h._M_element_count = 0;
  (this->named_param_map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->named_param_map)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->named_param_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

PreparedStatement::PreparedStatement(ErrorData error) : context(nullptr), success(false), error(std::move(error)) {
}